

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[49],kj::_::DebugComparison<unsigned_long,unsigned_int&>&,kj::ArrayPtr<unsigned_long_const>&,kj::ArrayPtr<unsigned_long_const>&,kj::ArrayPtr<void*const>&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [49],
               DebugComparison<unsigned_long,_unsigned_int_&> *params_1,
               ArrayPtr<const_unsigned_long> *params_2,ArrayPtr<const_unsigned_long> *params_3,
               ArrayPtr<void_*const> *params_4)

{
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  DebugComparison<unsigned_long,_unsigned_int_&> *params_00;
  ArrayPtr<const_unsigned_long> *params_01;
  ArrayPtr<const_unsigned_long> *params_02;
  ArrayPtr<void_*const> *params_03;
  long lVar1;
  String *in_stack_ffffffffffffff48;
  String argValues [5];
  
  str<char_const(&)[49]>
            (argValues,(kj *)params,(char (*) [49])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<unsigned_long,unsigned_int&>&>(argValues + 1,(kj *)params_1,params_00);
  str<kj::ArrayPtr<unsigned_long_const>&>(argValues + 2,(kj *)params_2,params_01);
  str<kj::ArrayPtr<unsigned_long_const>&>(argValues + 3,(kj *)params_3,params_02);
  str<kj::ArrayPtr<void*const>&>(argValues + 4,(kj *)params_4,params_03);
  argValues_00.size_ = (size_t)macroArgs;
  argValues_00.ptr = in_stack_ffffffffffffff48;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)argValues,argValues_00);
  lVar1 = 0x60;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}